

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testing.cpp
# Opt level: O0

void anon_unknown.dwarf_251e::printTestError
               (string *testName,size_t max1,size_t max2,size_t i,size_t res)

{
  ostream *poVar1;
  size_t res_local;
  size_t i_local;
  size_t max2_local;
  size_t max1_local;
  string *testName_local;
  
  poVar1 = std::operator<<((ostream *)&std::cerr,"Error in test \"");
  poVar1 = std::operator<<(poVar1,(string *)testName);
  poVar1 = std::operator<<(poVar1,"\"");
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cerr,"max: ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,max1);
  poVar1 = std::operator<<(poVar1," x ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,max2);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cerr,"i = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,i);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<((ostream *)&std::cerr,"test = ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,res);
  std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void printTestError(const string& testName, size_t max1, size_t max2, size_t i, size_t res) {
    cerr << "Error in test \"" << testName << "\"" << endl;
    cerr << "max: " << max1 << " x " << max2 << endl;
    cerr << "i = " << i << endl;
    cerr << "test = " << res << endl;
}